

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

void CVmObjDict::enum_word_props_cb(void *ctx0,CVmHashEntry *entry0)

{
  int iVar1;
  _func_int **pp_Var2;
  vm_val_t match_val;
  vm_val_t local_28;
  
  iVar1 = match_strings(*(CVmObjDict **)((long)ctx0 + 0x30),*(vm_val_t **)((long)ctx0 + 8),
                        *(char **)((long)ctx0 + 0x10),*(size_t *)((long)ctx0 + 0x18),entry0->str_,
                        entry0->len_,&local_28);
  if ((iVar1 != 0) && (pp_Var2 = entry0[1]._vptr_CVmHashEntry, pp_Var2 != (_func_int **)0x0)) {
    do {
      (**ctx0)(*(undefined8 *)((long)ctx0 + 0x20),*(undefined2 *)((long)pp_Var2 + 4),&local_28);
      pp_Var2 = (_func_int **)pp_Var2[1];
    } while (pp_Var2 != (_func_int **)0x0);
  }
  return;
}

Assistant:

void CVmObjDict::enum_word_props_cb(void *ctx0, CVmHashEntry *entry0)
{
    enum_word_props_ctx *ctx = (enum_word_props_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_val_t match_val;
    VMGLOB_PTR(ctx->globals);

    /* if this entry matches the search string, process it */
    if (ctx->dict->match_strings(vmg_ ctx->strval, ctx->strp, ctx->strl,
                                 entry->getstr(), entry->getlen(),
                                 &match_val))
    {
        vm_dict_entry *cur;
        
        /* process the items under this entry */
        for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
        {
            /* invoke the callback */
            (*ctx->cb_func)(vmg_ ctx->cb_ctx, cur->prop_, &match_val);
        }
    }
}